

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::ExecuteInternal(Clipper *this,bool fixHoleLinkages)

{
  bool bVar1;
  Scanbeam *pSVar2;
  long64 topY;
  OutRec *outRec;
  OutPt *pOVar3;
  OutPt *pOVar4;
  __normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
  __first;
  __normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
  __last;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  pointer ppOVar9;
  OutPt *pOVar10;
  ulong uVar11;
  long64 botY;
  double dVar12;
  
  (*this->_vptr_Clipper[3])();
  if (*(long *)(this->_vptr_Clipper[-3] +
               (long)&(this->m_PolyOuts).
                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
               ) == 0) {
    bVar6 = true;
  }
  else {
    pSVar2 = this->m_Scanbeam;
    botY = pSVar2->Y;
    this->m_Scanbeam = pSVar2->next;
    operator_delete(pSVar2);
    do {
      InsertLocalMinimaIntoAEL(this,botY);
      ClearHorzJoins(this);
      ProcessHorizontals(this);
      pSVar2 = this->m_Scanbeam;
      topY = pSVar2->Y;
      this->m_Scanbeam = pSVar2->next;
      operator_delete(pSVar2);
      bVar6 = ProcessIntersections(this,botY,topY);
      if (bVar6) {
        ProcessEdgesAtTopOfScanbeam(this,topY);
        botY = topY;
      }
    } while (bVar6 && this->m_Scanbeam != (Scanbeam *)0x0);
    if (bVar6) {
      ppOVar9 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_PolyOuts).
          super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppOVar9) {
        uVar11 = 0;
        do {
          outRec = ppOVar9[uVar11];
          if (outRec->pts != (OutPt *)0x0) {
            FixupOutPolygon(this,outRec);
            if (outRec->pts != (OutPt *)0x0) {
              if ((outRec->isHole & fixHoleLinkages) == 1) {
                FixHoleLinkage(this,outRec);
              }
              if (outRec->bottomPt == outRec->bottomFlag) {
                bVar7 = Orientation(outRec,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                 [(long)&(this->m_PolyOuts).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                 ]);
                dVar12 = Area(outRec,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ]);
                if (dVar12 <= 0.0 == bVar7) {
                  DisposeBottomPt(this,outRec);
                }
              }
              bVar7 = outRec->isHole;
              bVar1 = this->m_ReverseOutput;
              bVar8 = Orientation(outRec,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                               [(long)&(this->m_PolyOuts).
                                                                                                              
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                               ]);
              if (bVar7 == (bool)(bVar8 ^ bVar1)) {
                pOVar3 = outRec->pts;
                pOVar10 = pOVar3;
                do {
                  pOVar4 = pOVar10->next;
                  pOVar10->next = pOVar10->prev;
                  pOVar10->prev = pOVar4;
                  pOVar10 = pOVar4;
                } while (pOVar4 != pOVar3);
              }
            }
          }
          uVar11 = uVar11 + 1;
          ppOVar9 = (this->m_PolyOuts).
                    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)(this->m_PolyOuts).
                                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar9
                                 >> 3));
      }
      JoinCommonEdges(this,fixHoleLinkages);
      if (fixHoleLinkages) {
        __first._M_current =
             (this->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start;
        __last._M_current =
             (this->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          uVar11 = (long)__last._M_current - (long)__first._M_current >> 3;
          lVar5 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<ClipperLib::OutRec**,std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::OutRec*,ClipperLib::OutRec*)>>
                    (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(ClipperLib::OutRec_*,_ClipperLib::OutRec_*)>)0x6a54c9
                    );
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<ClipperLib::OutRec**,std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::OutRec*,ClipperLib::OutRec*)>>
                    (__first,__last,
                     (_Iter_comp_iter<bool_(*)(ClipperLib::OutRec_*,_ClipperLib::OutRec_*)>)0x6a54c9
                    );
        }
      }
    }
    ClearJoins(this);
    ClearHorzJoins(this);
  }
  return bVar6;
}

Assistant:

bool Clipper::ExecuteInternal(bool fixHoleLinkages)
{
  bool succeeded;
  try {
    Reset();
    if (!m_CurrentLM ) return true;
    long64 botY = PopScanbeam();
    do {
      InsertLocalMinimaIntoAEL(botY);
      ClearHorzJoins();
      ProcessHorizontals();
      long64 topY = PopScanbeam();
      succeeded = ProcessIntersections(botY, topY);
      if (!succeeded) break;
      ProcessEdgesAtTopOfScanbeam(topY);
      botY = topY;
    } while( m_Scanbeam );
  }
  catch(...) {
    succeeded = false;
  }

  if (succeeded)
  {
    //tidy up output polygons and fix orientations where necessary ...
    for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    {
      OutRec *outRec = m_PolyOuts[i];
      if (!outRec->pts) continue;
      FixupOutPolygon(*outRec);
      if (!outRec->pts) continue;
      if (outRec->isHole && fixHoleLinkages) FixHoleLinkage(outRec);

      if (outRec->bottomPt == outRec->bottomFlag &&
        (Orientation(outRec, m_UseFullRange) != (Area(*outRec, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec);

      if (outRec->isHole ==
        (m_ReverseOutput ^ Orientation(outRec, m_UseFullRange)))
          ReversePolyPtLinks(*outRec->pts);
    }

    JoinCommonEdges(fixHoleLinkages);
    if (fixHoleLinkages)
      std::sort(m_PolyOuts.begin(), m_PolyOuts.end(), PolySort);
  }

  ClearJoins();
  ClearHorzJoins();
  return succeeded;
}